

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderPackingFunctionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::UnpackSnorm2x16CaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UnpackSnorm2x16CaseInstance *this)

{
  pointer *ppVVar1;
  float fVar2;
  deUint32 dVar3;
  size_type sVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  ShaderExecutor *pSVar7;
  reference pvVar8;
  reference pvVar9;
  float *pfVar10;
  allocator<char> local_749;
  string local_748;
  undefined4 local_728;
  allocator<char> local_721;
  string local_720;
  int local_6fc;
  MessageBuilder local_6f8;
  MessageBuilder local_578;
  HexFloat local_3f8;
  HexFloat local_3f4;
  HexFloat local_3f0;
  HexFloat local_3ec;
  Hex<8UL> local_3e8;
  MessageBuilder local_3e0;
  deUint32 local_25c;
  uint local_258;
  deUint32 diff1;
  deUint32 diff0;
  float res1;
  float res0;
  float ref1;
  float ref0;
  deInt16 in1;
  deInt16 in0;
  int valNdx;
  int numFailed;
  int maxPrints;
  int numValues;
  reference local_228;
  void *out;
  void *in;
  MessageBuilder local_210;
  deUint32 local_8c;
  int local_88;
  value_type_conflict2 local_84;
  int ndx;
  value_type_conflict2 local_7c [6];
  value_type_conflict2 local_64;
  undefined1 local_60 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> outputs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputs;
  Random rnd;
  deUint32 maxDiff;
  UnpackSnorm2x16CaseInstance *this_local;
  
  rnd.m_rnd.z = 1;
  unique0x10000f35 = this;
  dVar3 = deStringHash((this->super_ShaderPackingFunctionTestInstance).m_name);
  de::Random::Random((Random *)
                     ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 4),dVar3 ^ 0x776002
                    );
  ppVVar1 = &outputs.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60);
  local_64 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,&local_64);
  local_7c[1] = 0x7fff8000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_7c + 1);
  local_7c[0] = 0x80007fff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,local_7c);
  ndx = -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&ndx);
  local_84 = 0x1fffe;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_84);
  for (local_88 = 0; local_88 < 0x5f; local_88 = local_88 + 1) {
    local_8c = de::Random::getUint32
                         ((Random *)
                          ((long)&inputs.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &outputs.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_8c);
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60,
             sVar4);
  pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_210,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<(&local_210,(char (*) [22])"Executing shader for ");
  in = (void *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &outputs.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(unsigned_long *)&in);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [14])" input values");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_210);
  ppVVar1 = &outputs.
             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  out = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,0);
  local_228 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_60,0);
  pSVar7 = de::details::
           UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           ::operator->(&(this->super_ShaderPackingFunctionTestInstance).m_executor.
                         super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                       );
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1);
  ::vk::Handle<(vk::HandleType)22>::Handle((Handle<(vk::HandleType)22> *)&maxPrints,0);
  (*pSVar7->_vptr_ShaderExecutor[2])(pSVar7,sVar4 & 0xffffffff,&out,&local_228,_maxPrints);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &outputs.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  numFailed = (int)sVar4;
  valNdx = 10;
  _in1 = 0;
  for (ref0 = 0.0; fVar2 = ref0,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &outputs.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
      (int)fVar2 < (int)sVar4; ref0 = (float)((int)ref0 + 1)) {
    ppVVar1 = &outputs.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._2_2_ = (short)*pvVar8;
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)ppVVar1,
                        (long)(int)ref0);
    ref1._0_2_ = *(short *)((long)pvVar8 + 2);
    res0 = de::clamp<float>((float)(int)ref1._2_2_ / 32767.0,-1.0,1.0);
    res1 = de::clamp<float>((float)(int)ref1._0_2_ / 32767.0,-1.0,1.0);
    pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_60,(long)(int)ref0);
    pfVar10 = tcu::Vector<float,_2>::x(pvVar9);
    diff0 = (deUint32)*pfVar10;
    pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                       ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                        local_60,(long)(int)ref0);
    pfVar10 = tcu::Vector<float,_2>::y(pvVar9);
    diff1 = (deUint32)*pfVar10;
    local_258 = shaderexecutor::anon_unknown_0::getUlpDiff(res0,(float)diff0);
    local_25c = shaderexecutor::anon_unknown_0::getUlpDiff(res1,(float)diff1);
    if ((1 < local_258) || (1 < local_25c)) {
      if (_in1 < 10) {
        pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_3e0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_3e0,(char (*) [26])"ERROR: Mismatch in value ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&ref0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x137d35a);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [28])"  expected unpackSnorm2x16(");
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &outputs.
                             super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)ref0);
        local_3e8 = tcu::toHex<unsigned_int>(*pvVar8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3e8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])0x131b1b7);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [6])0x138a6b5);
        shaderexecutor::anon_unknown_0::HexFloat::HexFloat(&local_3ec,res0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3ec);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x136aa81);
        shaderexecutor::anon_unknown_0::HexFloat::HexFloat(&local_3f0,res1);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3f0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x13159c9);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])", got vec2(");
        shaderexecutor::anon_unknown_0::HexFloat::HexFloat(&local_3f4,(float)diff0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3f4);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x136aa81);
        shaderexecutor::anon_unknown_0::HexFloat::HexFloat(&local_3f8,(float)diff1);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_3f8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x13159c9);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])"\n  ULP diffs = (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_258);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x136aa81);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_25c);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])"), max diff = ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&rnd.m_rnd.z);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3e0);
      }
      else if (_in1 == 10) {
        pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx)
        ;
        tcu::TestLog::operator<<(&local_578,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_578,(char (*) [4])"...");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_578);
      }
      _in1 = _in1 + 1;
    }
  }
  pTVar5 = tcu::TestContext::getLog((this->super_ShaderPackingFunctionTestInstance).m_testCtx);
  tcu::TestLog::operator<<(&local_6f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
  local_6fc = numFailed - _in1;
  pMVar6 = tcu::MessageBuilder::operator<<(&local_6f8,&local_6fc);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])" / ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&numFailed);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [15])" values passed");
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_6f8);
  if (_in1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"Pass",&local_721);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::allocator<char>::~allocator(&local_721);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"Result comparison failed",&local_749);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_748);
    std::__cxx11::string::~string((string *)&local_748);
    std::allocator<char>::~allocator(&local_749);
  }
  local_728 = 1;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &outputs.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  de::Random::~Random((Random *)
                      ((long)&inputs.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus iterate (void)
	{
		const deUint32				maxDiff		= 1; // Rounding error.
		de::Random					rnd			(deStringHash(m_name) ^ 0x776002);
		std::vector<deUint32>		inputs;
		std::vector<tcu::Vec2>		outputs;

		inputs.push_back(0x00000000u);
		inputs.push_back(0x7fff8000u);
		inputs.push_back(0x80007fffu);
		inputs.push_back(0xffffffffu);
		inputs.push_back(0x0001fffeu);

		// Random values.
		for (int ndx = 0; ndx < 95; ndx++)
			inputs.push_back(rnd.getUint32());

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deInt16	in0			= (deInt16)(deUint16)(inputs[valNdx] & 0xffff);
				const deInt16	in1			= (deInt16)(deUint16)(inputs[valNdx] >> 16);
				const float		ref0		= de::clamp(float(in0) / 32767.f, -1.0f, 1.0f);
				const float		ref1		= de::clamp(float(in1) / 32767.f, -1.0f, 1.0f);
				const float		res0		= outputs[valNdx].x();
				const float		res1		= outputs[valNdx].y();

				const deUint32	diff0	= getUlpDiff(ref0, res0);
				const deUint32	diff1	= getUlpDiff(ref1, res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx << ",\n"
															   << "  expected unpackSnorm2x16(" << tcu::toHex(inputs[valNdx]) << ") = "
															   << "vec2(" << HexFloat(ref0) << ", " << HexFloat(ref1) << ")"
															   << ", got vec2(" << HexFloat(res0) << ", " << HexFloat(res1) << ")"
															   << "\n  ULP diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			if (numFailed == 0)
				return tcu::TestStatus::pass("Pass");
			else
				return tcu::TestStatus::fail("Result comparison failed");

		}
	}